

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O3

Orientation * __thiscall
stateObservation::kine::Orientation::setToProductNoAlias
          (Orientation *this,Orientation *R1,Orientation *R2)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  long lVar7;
  char *pcVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  
  if ((R1->q_).isSet_.b_ == false) {
    if ((R1->m_).isSet_.b_ == false) goto LAB_00119c42;
    if ((R2->q_).isSet_.b_ == false) goto LAB_00119705;
LAB_0011970f:
    (this->m_).isSet_.b_ = true;
    if ((R1->m_).isSet_.b_ == false) {
      if (((R1->q_).isSet_.b_ != true) || ((R1->q_).assertMsg_.b_ == (char *)0x0))
      goto LAB_00119c23;
      dVar9 = (R1->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
      dVar2 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x18);
      dVar11 = dVar9 * (dVar9 + dVar9);
      dVar12 = (dVar9 + dVar9) * dVar2;
      dVar3 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 8);
      dVar6 = *(double *)
               ((long)(R1->q_).v_.m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array + 0x10);
      dVar13 = dVar3 + dVar3;
      dVar14 = dVar6 + dVar6;
      dVar16 = dVar14 * dVar3 - dVar12;
      (R1->m_).isSet_.b_ = true;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = 1.0 - (dVar13 * dVar3 + dVar14 * dVar6);
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = dVar9 * dVar13 + dVar14 * dVar2;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = dVar9 * dVar14 - dVar13 * dVar2;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = dVar9 * dVar13 - dVar14 * dVar2;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = 1.0 - (dVar14 * dVar6 + dVar11);
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = dVar14 * dVar3 + dVar12;
      auVar5._8_4_ = SUB84(dVar16,0);
      auVar5._0_8_ = dVar9 * dVar14 + dVar13 * dVar2;
      auVar5._12_4_ = (int)((ulong)dVar16 >> 0x20);
      *(undefined1 (*) [16])
       ((R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array + 6) = auVar5;
      (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = 1.0 - (dVar13 * dVar3 + dVar11);
      if (((R2->m_).isSet_.b_ == true) &&
         ((((R2->m_).assertMsg_.b_ != (char *)0x0 && ((this->m_).isSet_.b_ == true)) &&
          ((this->m_).assertMsg_.b_ != (char *)0x0)))) {
        lVar7 = 0;
        do {
          dVar9 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7);
          dVar2 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7 + 8);
          dVar3 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7 + 0x10);
          dVar6 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                  .m_data.array[1];
          dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4];
          dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7];
          pdVar1 = (double *)
                   ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                          .m_storage.m_data.array + lVar7);
          *pdVar1 = dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[6] +
                    dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[3] +
                    dVar9 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[0];
          pdVar1[1] = dVar3 * dVar12 + dVar2 * dVar11 + dVar9 * dVar6;
          pdVar1 = (double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7);
          *(double *)
           ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + lVar7 + 0x10) =
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] * pdVar1[1] +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar7 + 0x10) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * *pdVar1;
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
        goto LAB_00119c03;
      }
    }
    else {
      pcVar8 = (R1->m_).assertMsg_.b_;
      if ((R2->m_).isSet_.b_ == false) {
        if (pcVar8 != (char *)0x0) {
          if (((R2->q_).isSet_.b_ != true) || ((R2->q_).assertMsg_.b_ == (char *)0x0))
          goto LAB_00119c23;
          dVar9 = (R2->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[0];
          dVar2 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 0x18);
          dVar11 = dVar9 * (dVar9 + dVar9);
          dVar12 = (dVar9 + dVar9) * dVar2;
          dVar3 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 8);
          dVar6 = *(double *)
                   ((long)(R2->q_).v_.m_coeffs.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array + 0x10);
          dVar13 = dVar3 + dVar3;
          dVar14 = dVar6 + dVar6;
          dVar16 = dVar14 * dVar3 - dVar12;
          (R2->m_).isSet_.b_ = true;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = 1.0 - (dVar13 * dVar3 + dVar14 * dVar6);
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = dVar9 * dVar13 + dVar14 * dVar2;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = dVar9 * dVar14 - dVar13 * dVar2;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = dVar9 * dVar13 - dVar14 * dVar2;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = 1.0 - (dVar14 * dVar6 + dVar11);
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = dVar14 * dVar3 + dVar12;
          auVar4._8_4_ = SUB84(dVar16,0);
          auVar4._0_8_ = dVar9 * dVar14 + dVar13 * dVar2;
          auVar4._12_4_ = (int)((ulong)dVar16 >> 0x20);
          *(undefined1 (*) [16])
           ((R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array + 6) = auVar4;
          (R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] = 1.0 - (dVar13 * dVar3 + dVar11);
          if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
            lVar7 = 0;
            do {
              dVar9 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar7);
              dVar2 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar7 + 8);
              dVar3 = *(double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar7 + 0x10);
              dVar6 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1];
              dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[4];
              dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[7];
              pdVar1 = (double *)
                       ((long)(this->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar7);
              *pdVar1 = dVar3 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[6] +
                        dVar2 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3] +
                        dVar9 * (R1->m_).v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0];
              pdVar1[1] = dVar3 * dVar12 + dVar2 * dVar11 + dVar9 * dVar6;
              pdVar1 = (double *)
                       ((long)(R2->m_).v_.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array + lVar7);
              *(double *)
               ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar7 + 0x10) =
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[5] * pdVar1[1] +
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8] *
                   *(double *)
                    ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array + lVar7 + 0x10) +
                   (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2] * *pdVar1;
              lVar7 = lVar7 + 0x18;
            } while (lVar7 != 0x48);
            goto LAB_00119c03;
          }
        }
      }
      else if (((pcVar8 != (char *)0x0) && ((R2->m_).assertMsg_.b_ != (char *)0x0)) &&
              ((this->m_).assertMsg_.b_ != (char *)0x0)) {
        lVar7 = 0;
        do {
          dVar9 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7);
          dVar2 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7 + 8);
          dVar3 = *(double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7 + 0x10);
          dVar6 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                  .m_data.array[1];
          dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4];
          dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7];
          pdVar1 = (double *)
                   ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                          .m_storage.m_data.array + lVar7);
          *pdVar1 = dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[6] +
                    dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[3] +
                    dVar9 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            .m_storage.m_data.array[0];
          pdVar1[1] = dVar3 * dVar12 + dVar2 * dVar11 + dVar9 * dVar6;
          pdVar1 = (double *)
                   ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array + lVar7);
          *(double *)
           ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array + lVar7 + 0x10) =
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] * pdVar1[1] +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               *(double *)
                ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar7 + 0x10) +
               (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * *pdVar1;
          lVar7 = lVar7 + 0x18;
        } while (lVar7 != 0x48);
LAB_00119c03:
        (this->q_).isSet_.b_ = false;
        return this;
      }
    }
  }
  else {
    if ((R2->q_).isSet_.b_ == false) {
LAB_00119705:
      if ((R2->m_).isSet_.b_ == false) {
LAB_00119c42:
        __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                      ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
      }
      goto LAB_0011970f;
    }
    if (((R1->m_).isSet_.b_ != true) || ((R2->m_).isSet_.b_ != true)) {
      (this->m_).isSet_.b_ = false;
LAB_00119994:
      if (((((R1->q_).isSet_.b_ == true) && ((R1->q_).assertMsg_.b_ != (char *)0x0)) &&
          ((R2->q_).isSet_.b_ == true)) && ((R2->q_).assertMsg_.b_ != (char *)0x0)) {
        dVar2 = (R2->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0];
        dVar3 = *(double *)
                 ((long)(R2->q_).v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 8);
        dVar6 = *(double *)
                 ((long)(R2->q_).v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x10);
        dVar11 = *(double *)
                  ((long)(R2->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x18);
        dVar12 = (R1->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[0];
        dVar13 = *(double *)
                  ((long)(R1->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 8);
        dVar14 = *(double *)
                  ((long)(R1->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x10);
        dVar16 = *(double *)
                  ((long)(R1->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x18);
        dVar9 = dVar2 * dVar14 - dVar6 * dVar12;
        auVar15._8_4_ = SUB84(dVar9,0);
        auVar15._0_8_ = dVar3 * dVar14 - dVar11 * dVar12;
        auVar15._12_4_ = (int)((ulong)dVar9 >> 0x20);
        auVar15 = auVar15 ^ _DAT_0011c0d0;
        dVar9 = dVar12 * dVar2 + dVar14 * dVar6;
        auVar10._8_4_ = SUB84(dVar9,0);
        auVar10._0_8_ = dVar12 * dVar3 + dVar14 * dVar11;
        auVar10._12_4_ = (int)((ulong)dVar9 >> 0x20);
        auVar10 = auVar10 ^ _DAT_0011c140;
        (this->q_).isSet_.b_ = true;
        (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = auVar15._0_8_ + dVar6 * dVar13 + dVar2 * dVar16;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 8) = auVar15._8_8_ + dVar11 * dVar13 + dVar3 * dVar16;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x10) = auVar10._0_8_ + (dVar16 * dVar6 - dVar13 * dVar2);
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x18) = auVar10._8_8_ + (dVar16 * dVar11 - dVar13 * dVar3);
        return this;
      }
LAB_00119c23:
      pcVar8 = 
      "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
      ;
      goto LAB_00119c38;
    }
    if (((R1->m_).assertMsg_.b_ != (char *)0x0) && ((R2->m_).assertMsg_.b_ != (char *)0x0)) {
      (this->m_).isSet_.b_ = true;
      lVar7 = 0;
      do {
        dVar9 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar7);
        dVar2 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar7 + 8);
        dVar3 = *(double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar7 + 0x10);
        dVar6 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
        dVar11 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4];
        dVar12 = (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
        pdVar1 = (double *)
                 ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar7);
        *pdVar1 = dVar3 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[6] +
                  dVar2 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[3] +
                  dVar9 * (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0];
        pdVar1[1] = dVar3 * dVar12 + dVar2 * dVar11 + dVar9 * dVar6;
        pdVar1 = (double *)
                 ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar7);
        *(double *)
         ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                .m_data.array + lVar7 + 0x10) =
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] * pdVar1[1] +
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8] *
             *(double *)
              ((long)(R2->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar7 + 0x10) +
             (R1->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2] * *pdVar1;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x48);
      goto LAB_00119994;
    }
  }
  pcVar8 = 
  "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
  ;
LAB_00119c38:
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,pcVar8);
}

Assistant:

inline const Orientation & Orientation::setToProductNoAlias(const Orientation & R1, const Orientation & R2)
{
  R1.check_();
  R2.check_();
  if(R1.isQuaternionSet() && R2.isQuaternionSet())
  {
    if(R1.isMatrixSet() && R2.isMatrixSet())
    {
      m_.set().noalias() = R1.m_() * R2.m_();
    }
    else
    {
      m_.reset();
    }
    q_ = R1.q_() * R2.q_();
  }
  else
  {
    m_.set(true); /// we set the matrix as initialized before giving the value
    if(!R1.isMatrixSet())
    {
      m_().noalias() = R1.quaternionToMatrix_() * R2.m_();
    }
    else if(!R2.isMatrixSet())
    {
      m_().noalias() = R1.m_() * R2.quaternionToMatrix_();
    }
    else
    {
      m_().noalias() = R1.m_() * R2.m_();
    }
    q_.reset();
  }

  return *this;
}